

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O3

void __thiscall
duckdb::WriteAheadLogDeserializer::WriteAheadLogDeserializer
          (WriteAheadLogDeserializer *this,ReplayState *state_p,
          unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> *data_p,idx_t size
          ,bool deserialize_only)

{
  _Elt_pointer prVar1;
  
  this->state = state_p;
  this->db = state_p->db;
  this->context = state_p->context;
  this->catalog = state_p->catalog;
  (this->data).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (data_p->super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (data_p->super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  MemoryStream::MemoryStream
            (&this->stream,
             (this->data).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
             _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,size);
  (this->deserializer).super_Deserializer._vptr_Deserializer =
       (_func_int **)&PTR__Deserializer_024398b0;
  (this->deserializer).super_Deserializer.deserialize_enum_from_string = false;
  SerializationData::SerializationData(&(this->deserializer).super_Deserializer.data);
  (this->deserializer).super_Deserializer._vptr_Deserializer =
       (_func_int **)&PTR__Deserializer_0244e1d0;
  (this->deserializer).stream = &(this->stream).super_ReadStream;
  (this->deserializer).nesting_level = 0;
  (this->deserializer).has_buffered_field = false;
  (this->deserializer).buffered_field = 0;
  (this->deserializer).super_Deserializer.deserialize_enum_from_string = false;
  this->deserialize_only = deserialize_only;
  prVar1 = ((iterator *)
           ((long)&(this->deserializer).super_Deserializer.data.catalogs.c.
                   super__Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
                   ._M_impl + 0x30))->_M_cur;
  if (prVar1 == *(_Elt_pointer *)
                 ((long)&(this->deserializer).super_Deserializer.data.catalogs.c.
                         super__Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
                         ._M_impl + 0x40) + -1) {
    ::std::
    deque<std::reference_wrapper<duckdb::Catalog>,std::allocator<std::reference_wrapper<duckdb::Catalog>>>
    ::_M_push_back_aux<duckdb::Catalog&>
              ((deque<std::reference_wrapper<duckdb::Catalog>,std::allocator<std::reference_wrapper<duckdb::Catalog>>>
                *)&(this->deserializer).super_Deserializer.data.catalogs,this->catalog);
  }
  else {
    prVar1->_M_data = this->catalog;
    ((iterator *)
    ((long)&(this->deserializer).super_Deserializer.data.catalogs.c.
            super__Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
            ._M_impl + 0x30))->_M_cur = prVar1 + 1;
  }
  return;
}

Assistant:

WriteAheadLogDeserializer(ReplayState &state_p, unique_ptr<data_t[]> data_p, idx_t size,
	                          bool deserialize_only = false)
	    : state(state_p), db(state.db), context(state.context), catalog(state.catalog), data(std::move(data_p)),
	      stream(data.get(), size), deserializer(stream), deserialize_only(deserialize_only) {
		deserializer.Set<Catalog &>(catalog);
	}